

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_general.h
# Opt level: O2

char * mp::ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>_>::GetTypeName(void)

{
  int iVar1;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::GetTypeName()::
      name_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
                                 GetTypeName()::name_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"ComplementarityConstraint[",&local_69);
      AlgebraicExpression<mp::LinTerms>::GetTypeName_abi_cxx11_();
      std::operator+(&local_28,&local_48,&local_68);
      std::operator+(&ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
                      GetTypeName()::name_abi_cxx11_,&local_28,']');
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      __cxa_atexit(std::__cxx11::string::~string,
                   &ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::GetTypeName()
                    ::name_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::
                           GetTypeName()::name_abi_cxx11_);
    }
  }
  return ComplementarityConstraint<mp::AlgebraicExpression<mp::LinTerms>>::GetTypeName()::
         name_abi_cxx11_._M_dataplus._M_p;
}

Assistant:

static const char* GetTypeName() {
    static std::string name
      { std::string("ComplementarityConstraint[") +
          Expr::GetTypeName() + ']' };
    return name.c_str();
  }